

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FullSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::FullSegment::Cut
          (FullSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  size_t sVar4;
  value_type *pvVar5;
  long in_RSI;
  long in_RDI;
  WordRange wr_1;
  WordRange wr;
  DictUnit *du;
  size_t nextoffset;
  size_t j;
  size_t i;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> dags;
  size_t wordLen;
  size_t uIdx;
  size_t maxIdx;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> tRes;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *in_stack_fffffffffffffe08;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *in_stack_fffffffffffffe10;
  const_iterator in_stack_fffffffffffffe18;
  value_type *__x;
  LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *in_stack_fffffffffffffe20;
  WordRange local_1b8;
  WordRange local_1a8;
  DictUnit *local_198;
  value_type *local_190;
  ulong local_188;
  ulong local_180;
  vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> local_168;
  size_t local_150;
  ulong local_148;
  ulong local_140;
  long local_10;
  
  local_10 = in_RSI;
  limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::LocalVector
            (in_stack_fffffffffffffe20);
  local_140 = 0;
  local_148 = 0;
  local_150 = 0;
  if (*(long *)(in_RDI + 0x40) == 0) {
    __assert_fail("dictTrie_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/FullSegment.hpp"
                  ,0x3e,
                  "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                 );
  }
  std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::vector
            ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)0x1cdbf4);
  DictTrie::Find((DictTrie *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (const_iterator)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,0x1cdc1d);
  local_180 = 0;
  do {
    uVar1 = local_180;
    sVar2 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::size(&local_168);
    if (sVar2 <= uVar1) {
      std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::~vector
                ((vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_> *)in_stack_fffffffffffffe20)
      ;
      limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::~LocalVector
                (in_stack_fffffffffffffe10);
      return;
    }
    local_188 = 0;
    while( true ) {
      uVar1 = local_188;
      pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                         (&local_168,local_180);
      sVar4 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::size
                        (&pvVar3->nexts);
      if (sVar4 <= uVar1) break;
      pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                         (&local_168,local_180);
      in_stack_fffffffffffffe20 =
           (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)
           limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::operator[]
                     (&pvVar3->nexts,local_188);
      __x = (value_type *)in_stack_fffffffffffffe20->buffer_[0].first;
      local_190 = __x;
      pvVar5 = (value_type *)
               std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::size(&local_168);
      if (pvVar5 <= __x) {
        __assert_fail("nextoffset < dags.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/hscspring[P]cppjieba/include/cppjieba/FullSegment.hpp"
                      ,0x44,
                      "void cppjieba::FullSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &) const"
                     );
      }
      pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                         (&local_168,local_180);
      in_stack_fffffffffffffe10 =
           (LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_> *)
           limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::operator[]
                     (&pvVar3->nexts,local_188);
      local_198 = in_stack_fffffffffffffe10->buffer_[0].second;
      if (local_198 == (DictUnit *)0x0) {
        pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                           (&local_168,local_180);
        sVar4 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::size
                          (&pvVar3->nexts);
        if ((sVar4 == 1) && (local_140 <= local_148)) {
          WordRange::WordRange
                    (&local_1a8,(const_iterator)(local_10 + local_180 * 0x14),
                     (const_iterator)(local_10 + (long)local_190 * 0x14));
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                     in_stack_fffffffffffffe20,__x);
        }
      }
      else {
        local_150 = limonp::LocalVector<unsigned_int>::size(&local_198->word);
        if (local_150 < 2) {
          pvVar3 = std::vector<cppjieba::Dag,_std::allocator<cppjieba::Dag>_>::operator[]
                             (&local_168,local_180);
          sVar4 = limonp::LocalVector<std::pair<unsigned_long,_const_cppjieba::DictUnit_*>_>::size
                            (&pvVar3->nexts);
          if ((sVar4 != 1) || (local_148 < local_140)) goto LAB_001cde99;
        }
        WordRange::WordRange
                  (&local_1b8,(const_iterator)(local_10 + local_180 * 0x14),
                   (const_iterator)(local_10 + (long)local_190 * 0x14));
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                  ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                   in_stack_fffffffffffffe20,__x);
      }
LAB_001cde99:
      if (local_140 < local_148 + local_150) {
        local_140 = local_148 + local_150;
      }
      local_188 = local_188 + 1;
    }
    local_148 = local_148 + 1;
    local_180 = local_180 + 1;
  } while( true );
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, 
        RuneStrArray::const_iterator end, 
        vector<WordRange>& res) const {
    // result of searching in trie tree
    LocalVector<pair<size_t, const DictUnit*> > tRes;

    // max index of res's words
    size_t maxIdx = 0;

    // always equals to (uItr - begin)
    size_t uIdx = 0;

    // tmp variables
    size_t wordLen = 0;
    assert(dictTrie_);
    vector<struct Dag> dags;
    dictTrie_->Find(begin, end, dags);
    for (size_t i = 0; i < dags.size(); i++) {
      for (size_t j = 0; j < dags[i].nexts.size(); j++) {
        size_t nextoffset = dags[i].nexts[j].first;
        assert(nextoffset < dags.size());
        const DictUnit* du = dags[i].nexts[j].second;
        if (du == NULL) {
          if (dags[i].nexts.size() == 1 && maxIdx <= uIdx) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        } else {
          wordLen = du->word.size();
          if (wordLen >= 2 || (dags[i].nexts.size() == 1 && maxIdx <= uIdx)) {
            WordRange wr(begin + i, begin + nextoffset);
            res.push_back(wr);
          }
        }
        maxIdx = uIdx + wordLen > maxIdx ? uIdx + wordLen : maxIdx;
      }
      uIdx++;
    }
  }